

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatActivity.c
# Opt level: O0

void Msat_SolverClaRescaleActivity(Msat_Solver_t *p)

{
  int iVar1;
  Msat_Clause_t **ppMVar2;
  float fVar3;
  int local_20;
  float Activ;
  int i;
  int nLearned;
  Msat_Clause_t **pLearned;
  Msat_Solver_t *p_local;
  
  iVar1 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar2 = Msat_ClauseVecReadArray(p->vLearned);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    fVar3 = Msat_ClauseReadActivity(ppMVar2[local_20]);
    Msat_ClauseWriteActivity(ppMVar2[local_20],fVar3 * 1e-20);
  }
  p->dClaInc = p->dClaInc * 1e-20;
  return;
}

Assistant:

void Msat_SolverClaRescaleActivity( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned;
    int nLearned, i;
    float Activ;
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nLearned; i++ )
    {
        Activ = Msat_ClauseReadActivity( pLearned[i] );
        Msat_ClauseWriteActivity( pLearned[i], Activ * (float)1e-20 );
    }
    p->dClaInc *= 1e-20;
}